

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,float kappa,float delta,float theta,float obj_amp)

{
  int *piVar1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  rc_size rVar5;
  long lVar6;
  row_iterator prVar7;
  ulong uVar8;
  uint r_size;
  long lVar9;
  rc_data *__first;
  rc_data *prVar10;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_88;
  int local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  bit_array *local_70;
  _Head_base<0UL,_int_*,_false> local_68;
  row_iterator local_60;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_58;
  rc_data *local_50;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_48;
  undefined8 local_40;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_38;
  
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  local_80 = obj_amp;
  local_7c = theta;
  local_78 = delta;
  local_74 = kappa;
  local_70 = x;
  debug_logger<true>::log<float,float,float>
            ((debug_logger<true> *)this,fmt,&local_74,&local_78,&local_7c);
  if (first._M_current == last._M_current) {
    local_40._0_4_ = 0;
    local_40._4_4_ = 0;
  }
  else {
    local_48._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )((long)this + 0x10);
    local_40._0_4_ = 0;
    local_40._4_4_ = 0;
    local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)
         (tuple<int_*,_std::default_delete<int[]>_>)last._M_current;
    do {
      local_88 = (first._M_current)->first;
      sparse_matrix<int>::row
                ((sparse_matrix<int> *)&local_68,
                 (int)local_48._M_t.
                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                      _M_head_impl);
      if (local_60 != (row_iterator)local_68._M_head_impl) {
        lVar6 = *(long *)(this + 0x50);
        prVar7 = local_60;
        do {
          piVar1 = &prVar7->value;
          prVar7 = prVar7 + 1;
          *(float *)(lVar6 + (long)*piVar1 * 4) = local_7c * *(float *)(lVar6 + (long)*piVar1 * 4);
        } while (prVar7 != (row_iterator)local_68._M_head_impl);
      }
      local_38._M_head_impl = (col_value *)first._M_current;
      rVar5 = solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                          *)this,local_60,(row_iterator)local_68._M_head_impl,local_70);
      __first = *(rc_data **)(this + 0x60);
      r_size = rVar5.r_size;
      if (r_size != 0) {
        lVar9 = 0;
        lVar6 = *(long *)(*(long *)(this + 0x78) + 8);
        do {
          auVar2 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar6 + (long)local_60[*(int *)((long)&__first
                                                  ->id + lVar9)].column * 4)),
                                   ZEXT416((uint)local_80),
                                   ZEXT416(*(uint *)((long)&__first->value + lVar9)));
          *(int *)((long)&__first->value + lVar9) = auVar2._0_4_;
          lVar9 = lVar9 + 0xc;
        } while (((ulong)rVar5 & 0xffffffff) * 0xc != lVar9);
      }
      lVar6 = (long)(int)r_size;
      if (1 < lVar6) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        prVar10 = __first + lVar6;
        std::
        __introsort_loop<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar10,(int)LZCOUNT(lVar6) * 2 ^ 0x7e);
        local_50 = prVar10;
        std::
        __final_insertion_sort<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar10);
        lVar6 = lVar6 * 0xc + -0xc;
        prVar10 = __first;
        do {
          prVar10 = prVar10 + 1;
          if ((__first->value != prVar10->value) || (NAN(__first->value) || NAN(prVar10->value))) {
            std::
            shuffle<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,prVar10,__g);
            __first = prVar10;
          }
          lVar6 = lVar6 + -0xc;
        } while (lVar6 != 0);
        std::
        shuffle<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,local_50,__g);
        last._M_current =
             (pair<int,_int> *)
             local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
      }
      piVar1 = (int *)(*(long *)(this + 0x68) + (long)local_88 * 8);
      uVar4 = rVar5.c_size + *piVar1;
      if ((int)r_size < (int)uVar4) {
        uVar4 = r_size;
      }
      local_84 = uVar4 - 1;
      fmt_00._M_str = "constraints {}: {} = ";
      fmt_00._M_len = 0x15;
      debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&local_88,piVar1);
      if (0 < (int)r_size) {
        uVar8 = (ulong)(r_size & 0x7fffffff);
        lVar6 = 8;
        do {
          fmt_01._M_str = "{} ({}) ";
          fmt_01._M_len = 8;
          debug_logger<true>::log<float,int>
                    ((debug_logger<true> *)this,fmt_01,
                     (float *)(*(long *)(this + 0x60) + -8 + lVar6),
                     (int *)(*(long *)(this + 0x60) + lVar6));
          lVar6 = lVar6 + 0xc;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      fmt_02._M_str = " => Selected: {}\n";
      fmt_02._M_len = 0x11;
      debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&local_84);
      bVar3 = affect<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
                        ((solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                          *)this,local_70,local_60,local_88,local_84,r_size,local_74,local_78);
      local_40._0_1_ = (byte)local_40 | bVar3;
      first._M_current = (pair<int,_int> *)(local_38._M_head_impl + 1);
    } while (first._M_current != last._M_current);
  }
  return (bool)((byte)local_40 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].value);

            logger::log("constraints {}: {} = ", k, b[k].value);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }